

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O3

void vex_GE(PDISASM pMyDisasm,int mem1,int mem2,int mem3,int reg1,int reg2,int reg3)

{
  UInt8 UVar1;
  UInt8 UVar2;
  int iVar3;
  Int32 IVar4;
  
  UVar1 = (pMyDisasm->Reserved_).EVEX.state;
  if (UVar1 == '\x01') {
    UVar2 = (pMyDisasm->Reserved_).EVEX.vvvv;
  }
  else {
    UVar2 = (pMyDisasm->Reserved_).VEX.vvvv;
  }
  if (UVar2 != '\x0f') {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  UVar2 = (pMyDisasm->Reserved_).VEX.L;
  if (UVar2 == '\x01') {
    iVar3 = (uint)(UVar1 == '\x01') * 0x20000 + 0x120000;
    IVar4 = 8;
    reg1 = reg2;
    mem1 = mem2;
  }
  else if (UVar2 == '\0') {
    iVar3 = 0x110000;
    if (UVar1 == '\x01') {
      iVar3 = 0x140000;
    }
    IVar4 = 4;
  }
  else {
    if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') {
      return;
    }
    IVar4 = 0x10;
    iVar3 = 0x140000;
    reg1 = reg3;
    mem1 = mem3;
  }
  (pMyDisasm->Instruction).Category = iVar3;
  (pMyDisasm->Reserved_).Register_ = reg1;
  (pMyDisasm->Reserved_).MemDecoration = mem1;
  decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
  (pMyDisasm->Reserved_).Register_ = IVar4;
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ vex_GE(PDISASM pMyDisasm, int mem1, int mem2, int mem3, int reg1, int reg2, int reg3)
{
  verifyVEXvvvv(pMyDisasm);
  if (GV.VEX.L == 0) {
    pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
    GV.Register_ = reg1;
    GV.MemDecoration = mem1;
    decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
    GV.Register_ = SSE_REG;
    decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
    GV.EIP_ += GV.DECALAGE_EIP+2;
  }
  else if (GV.VEX.L == 0x1) {
    pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX2_INSTRUCTION;
    GV.Register_ = reg2;
    GV.MemDecoration = mem2;
    decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
    GV.Register_ = AVX_REG;
    decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
    GV.EIP_ += GV.DECALAGE_EIP+2;
  }
  else if (GV.EVEX.LL == 0x2) {
    pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
    GV.Register_ = reg3;
    GV.MemDecoration = mem3;
    decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
    GV.Register_ = AVX512_REG;
    decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
    GV.EIP_ += GV.DECALAGE_EIP+2;
  }
}